

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_env.c
# Opt level: O0

void create_optional_class(void)

{
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  gravity_value_t value_04;
  gravity_value_t value_05;
  gravity_value_t value_06;
  gravity_value_t value_07;
  gravity_value_t value_08;
  gravity_value_t value_09;
  gravity_value_t value_10;
  gravity_value_t value_11;
  gravity_value_t value_12;
  gravity_value_t value_13;
  gravity_value_t value_14;
  gravity_value_t value_15;
  gravity_value_t value_16;
  gravity_value_t value_17;
  gravity_value_t value_18;
  gravity_value_t value_19;
  gravity_value_t value_20;
  gravity_value_t value_21;
  gravity_value_t value_22;
  gravity_value_t value_23;
  gravity_value_t value_24;
  gravity_value_t value_25;
  gravity_value_t value_26;
  gravity_value_t value_27;
  gravity_value_t value_28;
  gravity_value_t value_29;
  gravity_value_t value_30;
  gravity_value_t value_31;
  gravity_class_t *c;
  gravity_function_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_class_t *pgVar3;
  gravity_closure_t *closure;
  gravity_class_t *meta;
  
  gravity_class_math = gravity_class_new_pair((gravity_vm *)0x0,"Math",(gravity_class_t *)0x0,0,0);
  c = gravity_class_get_meta(gravity_class_math);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_abs,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_31.field_1.p = (gravity_object_t *)aVar2.n;
  value_31.isa = pgVar3;
  gravity_class_bind(c,"abs",value_31);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_acos,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_30.field_1.p = (gravity_object_t *)aVar2.n;
  value_30.isa = pgVar3;
  gravity_class_bind(c,"acos",value_30);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_asin,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_29.field_1.p = (gravity_object_t *)aVar2.n;
  value_29.isa = pgVar3;
  gravity_class_bind(c,"asin",value_29);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_atan,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_28.field_1.p = (gravity_object_t *)aVar2.n;
  value_28.isa = pgVar3;
  gravity_class_bind(c,"atan",value_28);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_atan2,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_27.field_1.p = (gravity_object_t *)aVar2.n;
  value_27.isa = pgVar3;
  gravity_class_bind(c,"atan2",value_27);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_cbrt,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_26.field_1.p = (gravity_object_t *)aVar2.n;
  value_26.isa = pgVar3;
  gravity_class_bind(c,"cbrt",value_26);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_xrt,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_25.field_1.p = (gravity_object_t *)aVar2.n;
  value_25.isa = pgVar3;
  gravity_class_bind(c,"xrt",value_25);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_ceil,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_24.field_1.p = (gravity_object_t *)aVar2.n;
  value_24.isa = pgVar3;
  gravity_class_bind(c,"ceil",value_24);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_cos,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_23.field_1.p = (gravity_object_t *)aVar2.n;
  value_23.isa = pgVar3;
  gravity_class_bind(c,"cos",value_23);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_exp,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_22.field_1.p = (gravity_object_t *)aVar2.n;
  value_22.isa = pgVar3;
  gravity_class_bind(c,"exp",value_22);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_floor,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_21.field_1.p = (gravity_object_t *)aVar2.n;
  value_21.isa = pgVar3;
  gravity_class_bind(c,"floor",value_21);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_gcf,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_20.field_1.p = (gravity_object_t *)aVar2.n;
  value_20.isa = pgVar3;
  gravity_class_bind(c,"gcf",value_20);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_lcm,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_19.field_1.p = (gravity_object_t *)aVar2.n;
  value_19.isa = pgVar3;
  gravity_class_bind(c,"lcm",value_19);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_lerp,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_18.field_1.p = (gravity_object_t *)aVar2.n;
  value_18.isa = pgVar3;
  gravity_class_bind(c,"lerp",value_18);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_log,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_17.field_1.p = (gravity_object_t *)aVar2.n;
  value_17.isa = pgVar3;
  gravity_class_bind(c,"log",value_17);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_log10,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_16.field_1.p = (gravity_object_t *)aVar2.n;
  value_16.isa = pgVar3;
  gravity_class_bind(c,"log10",value_16);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_logx,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_15.field_1.p = (gravity_object_t *)aVar2.n;
  value_15.isa = pgVar3;
  gravity_class_bind(c,"logx",value_15);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_max,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_14.field_1.p = (gravity_object_t *)aVar2.n;
  value_14.isa = pgVar3;
  gravity_class_bind(c,"max",value_14);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_min,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_13.field_1.p = (gravity_object_t *)aVar2.n;
  value_13.isa = pgVar3;
  gravity_class_bind(c,"min",value_13);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_pow,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_12.field_1.p = (gravity_object_t *)aVar2.n;
  value_12.isa = pgVar3;
  gravity_class_bind(c,"pow",value_12);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_random,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_11.field_1.p = (gravity_object_t *)aVar2.n;
  value_11.isa = pgVar3;
  gravity_class_bind(c,"random",value_11);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_round,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_10.field_1.p = (gravity_object_t *)aVar2.n;
  value_10.isa = pgVar3;
  gravity_class_bind(c,"round",value_10);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_sin,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_09.field_1.p = (gravity_object_t *)aVar2.n;
  value_09.isa = pgVar3;
  gravity_class_bind(c,"sin",value_09);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_sqrt,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_08.field_1.p = (gravity_object_t *)aVar2.n;
  value_08.isa = pgVar3;
  gravity_class_bind(c,"sqrt",value_08);
  pgVar3 = gravity_class_closure;
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_tan,0);
  aVar2.p = (gravity_object_t *)gravity_closure_new((gravity_vm *)0x0,pgVar1);
  value_07.field_1.p = (gravity_object_t *)aVar2.n;
  value_07.isa = pgVar3;
  gravity_class_bind(c,"tan",value_07);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_PI,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_06.field_1.p = (gravity_object_t *)aVar2.n;
  value_06.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"PI",value_06);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_E,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_05.field_1.p = (gravity_object_t *)aVar2.n;
  value_05.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"E",value_05);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_LN2,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_04.field_1.p = (gravity_object_t *)aVar2.n;
  value_04.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"LN2",value_04);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_LN10,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_03.field_1.p = (gravity_object_t *)aVar2.n;
  value_03.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"LN10",value_03);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_LOG2E,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_02.field_1.p = (gravity_object_t *)aVar2.n;
  value_02.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"LOG2E",value_02);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_LOG10E,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_01.field_1.p = (gravity_object_t *)aVar2.n;
  value_01.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"LOG10E",value_01);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_SQRT2,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value_00.field_1.p = (gravity_object_t *)aVar2.n;
  value_00.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"SQRT2",value_00);
  pgVar1 = gravity_function_new_internal((gravity_vm *)0x0,(char *)0x0,math_SQRT1_2,0);
  aVar2.p = (gravity_object_t *)
            computed_property_create((gravity_vm *)0x0,pgVar1,(gravity_function_t *)0x0);
  value.field_1.p = (gravity_object_t *)aVar2.n;
  value.isa = (aVar2.p)->isa;
  gravity_class_bind(c,"SQRT1_2",value);
  pgVar3 = gravity_class_get_meta(gravity_class_math);
  pgVar3->is_inited = true;
  return;
}

Assistant:

static void create_optional_class (void) {
    gravity_class_env = gravity_class_new_pair(NULL, GRAVITY_CLASS_ENV_NAME, NULL, 0, 0);
    gravity_class_t *meta = gravity_class_get_meta(gravity_class_env);
    
    // .get(key) and .set(key, value)
    gravity_class_bind(meta, "get", NEW_CLOSURE_VALUE(gravity_env_get));
    gravity_class_bind(meta, "set", NEW_CLOSURE_VALUE(gravity_env_set));
    gravity_class_bind(meta, "keys", NEW_CLOSURE_VALUE(gravity_env_keys));
    
    // Allow map-access
    gravity_class_bind(meta, GRAVITY_INTERNAL_LOADAT_NAME, NEW_CLOSURE_VALUE(gravity_env_get));
    gravity_class_bind(meta, GRAVITY_INTERNAL_STOREAT_NAME, NEW_CLOSURE_VALUE(gravity_env_set));

    gravity_closure_t *closure = NULL;
    closure = computed_property_create(NULL, NEW_FUNCTION(gravity_env_argc), NULL);
    gravity_class_bind(meta, "argc", VALUE_FROM_OBJECT(closure));
    closure = computed_property_create(NULL, NEW_FUNCTION(gravity_env_argv), NULL);
    gravity_class_bind(meta, "argv", VALUE_FROM_OBJECT(closure));

    SETMETA_INITED(gravity_class_env);
}